

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::TPZCompElWithMem
          (TPZCompElWithMem<TPZInterfaceElement> *this,TPZCompMesh *mesh,
          TPZCompElWithMem<TPZInterfaceElement> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  *(undefined ***)&(this->super_TPZInterfaceElement).super_TPZCompEl = &PTR__TPZSavable_0175d048;
  TPZInterfaceElement::TPZInterfaceElement
            (&this->super_TPZInterfaceElement,&PTR_PTR_0175c290,mesh,
             &copy->super_TPZInterfaceElement,gl2lcConMap,gl2lcElMap);
  *(undefined ***)&(this->super_TPZInterfaceElement).super_TPZCompEl =
       &PTR__TPZCompElWithMem_0175c030;
  TPZStack<long,_128>::TPZStack(&this->fIntPtIndices);
  CopyIntPtIndicesFrom(this,copy);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh,
                                          const TPZCompElWithMem<TBASE> &copy,
                                          std::map<int64_t,int64_t> & gl2lcConMap,
                                          std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh,copy,gl2lcConMap,gl2lcElMap)
{
    CopyIntPtIndicesFrom(copy);
}